

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O0

void __thiscall gimage::BasicImageIO::loadProperties(BasicImageIO *this,Properties *prop,char *name)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  _Ios_Openmode _Var4;
  char *in_RDX;
  ifstream in_1;
  ifstream in;
  bool available;
  size_t pos;
  string s;
  undefined4 in_stack_fffffffffffffaa8;
  undefined1 in_stack_fffffffffffffaac;
  undefined1 in_stack_fffffffffffffaad;
  byte in_stack_fffffffffffffaae;
  byte in_stack_fffffffffffffaaf;
  string *in_stack_fffffffffffffab0;
  char *in_stack_fffffffffffffad0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffad8;
  string local_510 [32];
  char local_4f0 [520];
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [32];
  char local_288 [520];
  string local_80 [39];
  byte local_59;
  ulong local_58;
  allocator local_39;
  string local_38 [32];
  char *local_18;
  
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,in_RDX,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  local_59 = 0;
  local_58 = std::__cxx11::string::rfind((char)local_38,0x3a);
  if (local_58 != 0xffffffffffffffff) {
    iVar3 = std::__cxx11::string::compare((ulong)local_38,local_58,(char *)0x2);
    if (iVar3 == 0) {
      local_58 = 0xffffffffffffffff;
    }
  }
  if (local_58 != 0xffffffffffffffff) {
    std::__cxx11::string::substr((ulong)local_80,(ulong)local_38);
    in_stack_fffffffffffffab0 = local_80;
    std::__cxx11::string::operator=(local_38,in_stack_fffffffffffffab0);
    std::__cxx11::string::~string(in_stack_fffffffffffffab0);
    std::ifstream::ifstream(local_288);
    std::operator+(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
    _Var4 = std::__cxx11::string::c_str();
    std::ifstream::open(local_288,_Var4);
    std::__cxx11::string::~string(local_2a8);
    in_stack_fffffffffffffaaf = std::ios::fail();
    if ((in_stack_fffffffffffffaaf & 1) == 0) {
      local_59 = 1;
      gutil::Properties::load
                ((Properties *)in_stack_fffffffffffffab0,
                 (istream *)
                 CONCAT17(in_stack_fffffffffffffaaf,
                          CONCAT16(in_stack_fffffffffffffaae,
                                   CONCAT15(in_stack_fffffffffffffaad,
                                            CONCAT14(in_stack_fffffffffffffaac,
                                                     in_stack_fffffffffffffaa8)))));
      std::ifstream::close();
    }
    std::operator+(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
    _Var4 = std::__cxx11::string::c_str();
    std::ifstream::open(local_288,_Var4);
    std::__cxx11::string::~string(local_2c8);
    in_stack_fffffffffffffaae = std::ios::fail();
    if ((in_stack_fffffffffffffaae & 1) == 0) {
      local_59 = 1;
      gutil::Properties::load
                ((Properties *)in_stack_fffffffffffffab0,
                 (istream *)
                 CONCAT17(in_stack_fffffffffffffaaf,
                          CONCAT16(in_stack_fffffffffffffaae,
                                   CONCAT15(in_stack_fffffffffffffaad,
                                            CONCAT14(in_stack_fffffffffffffaac,
                                                     in_stack_fffffffffffffaa8)))));
      std::ifstream::close();
    }
    std::ifstream::~ifstream(local_288);
  }
  if ((local_59 & 1) == 0) {
    std::__cxx11::string::operator=(local_38,local_18);
    local_58 = std::__cxx11::string::rfind((char)local_38,0x2e);
    if (local_58 != 0xffffffffffffffff) {
      std::__cxx11::string::substr((ulong)local_2e8,(ulong)local_38);
      std::__cxx11::string::operator=(local_38,local_2e8);
      std::__cxx11::string::~string(local_2e8);
    }
    std::ifstream::ifstream(local_4f0);
    std::operator+(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
    _Var4 = std::__cxx11::string::c_str();
    std::ifstream::open(local_4f0,_Var4);
    std::__cxx11::string::~string(local_510);
    bVar1 = std::ios::fail();
    if ((bVar1 & 1) == 0) {
      gutil::Properties::load
                ((Properties *)in_stack_fffffffffffffab0,
                 (istream *)
                 CONCAT17(in_stack_fffffffffffffaaf,
                          CONCAT16(in_stack_fffffffffffffaae,
                                   CONCAT15(bVar1,CONCAT14(in_stack_fffffffffffffaac,
                                                           in_stack_fffffffffffffaa8)))));
      std::ifstream::close();
    }
    std::operator+(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
    _Var4 = std::__cxx11::string::c_str();
    std::ifstream::open(local_4f0,_Var4);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffad0);
    bVar2 = std::ios::fail();
    if ((bVar2 & 1) == 0) {
      gutil::Properties::load
                ((Properties *)in_stack_fffffffffffffab0,
                 (istream *)
                 CONCAT17(in_stack_fffffffffffffaaf,
                          CONCAT16(in_stack_fffffffffffffaae,
                                   CONCAT15(bVar1,CONCAT14(bVar2,in_stack_fffffffffffffaa8)))));
      std::ifstream::close();
    }
    std::ifstream::~ifstream(local_4f0);
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void BasicImageIO::loadProperties(gutil::Properties &prop, const char *name) const
{
  std::string s=name;
  size_t pos;
  bool available=false;

  pos=s.rfind(':');

  if (pos != s.npos && s.compare(pos, 2, ":\\") == 0)
  {
    pos=s.npos;
  }

  if (pos != s.npos)
  {
    // try loading as tiled image

    s=s.substr(0, pos);

    std::ifstream in;
    in.open((s+".hdr").c_str(), std::ifstream::in);

    if (!in.fail())
    {
      available=true;
      prop.load(in);
      in.close();
    }

    in.open((s+"_param.txt").c_str(), std::ifstream::in);

    if (!in.fail())
    {
      available=true;
      prop.load(in);
      in.close();
    }
  }

  if (!available)
  {
    // loading as normal image

    s=name;
    pos=s.rfind('.');

    if (pos != s.npos)
    {
      s=s.substr(0, pos);
    }

    std::ifstream in;
    in.open((s+".hdr").c_str(), std::ifstream::in);

    if (!in.fail())
    {
      prop.load(in);
      in.close();
    }

    in.open((s+"_param.txt").c_str(), std::ifstream::in);

    if (!in.fail())
    {
      prop.load(in);
      in.close();
    }
  }
}